

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

Fl_Tree_Item * __thiscall Fl_Tree_Item::next(Fl_Tree_Item *this)

{
  Fl_Tree_Item *this_00;
  int iVar1;
  Fl_Tree_Item **ppFVar2;
  
  if ((this->_children)._total == 0) {
    do {
      this_00 = this->_parent;
      if (this_00 == (Fl_Tree_Item *)0x0) {
        return (Fl_Tree_Item *)0x0;
      }
      iVar1 = find_child(this_00,this);
      this = this_00;
    } while ((this_00->_children)._total <= iVar1 + 1);
    ppFVar2 = (this_00->_children)._items + (iVar1 + 1);
  }
  else {
    ppFVar2 = (this->_children)._items;
  }
  return *ppFVar2;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::next() {
  Fl_Tree_Item *p, *c = this;
  if ( c->has_children() ) {
    return(c->child(0));
  }
#if FLTK_ABI_VERSION >= 10301
  // NEW
  while ( ( p = c->parent() ) != NULL ) {	// loop upwards through parents
    if ( c->_next_sibling )			// not last child?
      return(c->_next_sibling);			// return next child
    c = p;					// child becomes parent to move up generation
  }						// loop: moves up to next parent
#else /*FLTK_ABI_VERSION*/
  // OLD
  while ( ( p = c->parent() ) != NULL ) {	// loop upwards through parents
    int t = p->find_child(c);			// find our position in parent's children[] array
    if ( ++t < p->children() )			// not last child?
      return(p->child(t));			// return next child
    c = p;					// child becomes parent to move up generation
  }						// loop: moves up to next parent
#endif /*FLTK_ABI_VERSION*/
  return(0);					// hit root? done
}